

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O0

GMM_STATUS
GmmGetLogicalTileShape
          (uint32_t TileMode,uint32_t *pWidthInBytes,uint32_t *pHeight,uint32_t *pDepth,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  GMM_PLATFORM_INFO *pGVar1;
  GMM_LIB_CONTEXT *pGmmLibContext_local;
  uint32_t *pDepth_local;
  uint32_t *pHeight_local;
  uint32_t *pWidthInBytes_local;
  uint32_t TileMode_local;
  
  if (pWidthInBytes != (uint32_t *)0x0) {
    pGVar1 = GmmLib::Context::GetPlatformInfo(pGmmLibContext);
    *pWidthInBytes = pGVar1->TileInfo[TileMode].LogicalTileWidth;
  }
  if (pHeight != (uint32_t *)0x0) {
    pGVar1 = GmmLib::Context::GetPlatformInfo(pGmmLibContext);
    *pHeight = pGVar1->TileInfo[TileMode].LogicalTileHeight;
  }
  if (pDepth != (uint32_t *)0x0) {
    pGVar1 = GmmLib::Context::GetPlatformInfo(pGmmLibContext);
    *pDepth = pGVar1->TileInfo[TileMode].LogicalTileDepth;
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmGetLogicalTileShape(uint32_t  TileMode,
                                              uint32_t *pWidthInBytes,
                                              uint32_t *pHeight,
                                              uint32_t *pDepth,
                                              GMM_LIB_CONTEXT *pGmmLibContext)
{
    __GMM_ASSERT(TileMode < GMM_TILE_MODES);

    if(pWidthInBytes)
    {
        *pWidthInBytes = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileWidth;
    }

    if(pHeight)
    {
        *pHeight = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileHeight;
    }

    if(pDepth)
    {
        *pDepth = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileDepth;
    }

    return GMM_SUCCESS;
}